

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandTopo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      pcVar4 = "Empty network.\n";
    }
    else if (pAVar3->ntkType == ABC_NTK_LOGIC) {
      pAVar3 = Abc_NtkDupDfs(pAVar3);
      if (pAVar3 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        return 0;
      }
      pcVar4 = "The command has failed.\n";
    }
    else {
      pcVar4 = "This command can only be applied to a logic network.\n";
    }
    Abc_Print(-1,pcVar4);
  }
  else {
    fwrite("usage: topo [-vh]\n",0x12,1,(FILE *)pAbc->Err);
    fwrite("\t           rearranges nodes to be in a topological order\n",0x3a,1,(FILE *)pAbc->Err);
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
            pcVar4);
    fwrite("\t-h       : print the command usage\n",0x24,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int Scl_CommandTopo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkDupDfs( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: topo [-vh]\n" );
    fprintf( pAbc->Err, "\t           rearranges nodes to be in a topological order\n" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}